

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

void prepbitset(rnndb *db,rnnbitset *bs)

{
  char *pcVar1;
  char *local_38;
  int local_1c;
  int i;
  rnnbitset *bs_local;
  rnndb *db_local;
  
  prepvarinfo(db,bs->name,&bs->varinfo,(rnnvarinfo *)0x0);
  if (bs->isinline == 0) {
    for (local_1c = 0; local_1c < bs->bitfieldsnum; local_1c = local_1c + 1) {
      if (bs->bare == 0) {
        local_38 = bs->name;
      }
      else {
        local_38 = (char *)0x0;
      }
      prepbitfield(db,bs->bitfields[local_1c],local_38,&bs->varinfo);
    }
    pcVar1 = catstr((bs->varinfo).prefix,bs->name);
    bs->fullname = pcVar1;
  }
  return;
}

Assistant:

static void prepbitset(struct rnndb *db, struct rnnbitset *bs) {
	prepvarinfo (db, bs->name, &bs->varinfo, 0);
	int i;
	if (bs->isinline)
		return;
	for (i = 0; i < bs->bitfieldsnum; i++)
		prepbitfield(db, bs->bitfields[i], bs->bare?0:bs->name, &bs->varinfo);
	bs->fullname = catstr(bs->varinfo.prefix, bs->name);
}